

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * google::protobuf::internal::GetPrototypeForWeakDescriptor
                    (DescriptorTable *table,int index,bool force_build)

{
  char *__s;
  int iVar1;
  DescriptorPool *this;
  size_t sVar2;
  FileDescriptor *pFVar3;
  Descriptor *pDVar4;
  MessageFactory *pMVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  anon_class_8_1_a8aa2aee *fn;
  anon_class_8_1_a8aa2aee *extraout_RDX;
  long lVar7;
  long lVar8;
  string_view name;
  int local_3c;
  anon_class_8_1_a81517f2 local_38;
  Message *pMVar6;
  
  fn = (anon_class_8_1_a8aa2aee *)CONCAT71(in_register_00000011,force_build);
  local_3c = index;
  if ((init_protobuf_defaults_state & 1) == 0) {
    InitProtobufDefaultsSlow();
    fn = extraout_RDX;
  }
  pMVar6 = table->default_instances[local_3c];
  if (force_build && pMVar6 == (Message *)0x0) {
    local_38.index = (int *)table;
    if ((table->once->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::internal::AssignDescriptors(google::protobuf::internal::DescriptorTable_const*)::__0>
                (&table->once->control_,(SchedulingMode)&local_38,fn);
    }
    this = DescriptorPool::internal_generated_pool();
    __s = table->filename;
    sVar2 = strlen(__s);
    name._M_str = __s;
    name._M_len = sVar2;
    pFVar3 = DescriptorPool::FindFileByName(this,name);
    local_38.index = &local_3c;
    if (pFVar3->message_type_count_ < 1) {
      pDVar4 = (Descriptor *)0x0;
    }
    else {
      lVar7 = 0;
      lVar8 = 0;
      do {
        pDVar4 = cpp::
                 VisitDescriptorsInFileOrder<google::protobuf::internal::GetPrototypeForWeakDescriptor(google::protobuf::internal::DescriptorTable_const*,int,bool)::__0>
                           ((Descriptor *)(&pFVar3->message_types_->super_SymbolBase + lVar7),
                            &local_38);
        if (pDVar4 != (Descriptor *)0x0) break;
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0xa0;
        pDVar4 = (Descriptor *)0x0;
      } while (lVar8 < pFVar3->message_type_count_);
    }
    pMVar5 = MessageFactory::generated_factory();
    iVar1 = (*pMVar5->_vptr_MessageFactory[2])(pMVar5,pDVar4);
    pMVar6 = (Message *)CONCAT44(extraout_var,iVar1);
  }
  return pMVar6;
}

Assistant:

const Message* GetPrototypeForWeakDescriptor(const DescriptorTable* table,
                                             int index, bool force_build) {
  // First, make sure we inject the surviving default instances.
  InitProtobufDefaults();

  // Now check if the table has it. If so, return it.
  if (const auto* msg = table->default_instances[index]) {
    return msg;
  }

  if (!force_build) {
    return nullptr;
  }

  // Fallback to dynamic messages.
  // Register the dep and generate the prototype via the generated pool.
  AssignDescriptors(table);

  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);

  const Descriptor* descriptor = internal::cpp::VisitDescriptorsInFileOrder(
      file, [&](auto* desc) -> const Descriptor* {
        if (index == 0) return desc;
        --index;
        return nullptr;
      });

  return MessageFactory::generated_factory()->GetPrototype(descriptor);
}